

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneVectorBase::_growingReserve
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  uint in_ECX;
  uint32_t in_EDX;
  undefined8 in_RSI;
  ZoneAllocator *in_RDI;
  uint32_t capacity;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  Error EVar1;
  
  if (*(uint *)(in_RDI + 0xc) < in_ECX) {
    ZoneVector_growCapacity(*(uint *)(in_RDI + 0xc),in_ECX,in_EDX);
    EVar1 = _reserve((ZoneVectorBase *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                     ,in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI);
  }
  else {
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error ZoneVectorBase::_growingReserve(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t capacity = _capacity;
  if (capacity >= n)
    return kErrorOk;
  return _reserve(allocator, sizeOfT, ZoneVector_growCapacity(capacity, n, sizeOfT));
}